

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O1

bool __thiscall
spvtools::SpirvTools::Disassemble
          (SpirvTools *this,uint32_t *binary,size_t binary_size,string *text,uint32_t options)

{
  spv_result_t sVar1;
  spv_text spvtext;
  spv_text local_20;
  
  local_20 = (spv_text)0x0;
  sVar1 = spvBinaryToText(((this->impl_)._M_t.
                           super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                           .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl)
                          ->context,binary,binary_size,options,&local_20,(spv_diagnostic *)0x0);
  if ((options & 2) == 0 && sVar1 == SPV_SUCCESS) {
    if (local_20 == (spv_text)0x0) {
      __assert_fail("spvtext",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/libspirv.cpp"
                    ,0x68,
                    "bool spvtools::SpirvTools::Disassemble(const uint32_t *, const size_t, std::string *, uint32_t) const"
                   );
    }
    std::__cxx11::string::replace((ulong)text,0,(char *)text->_M_string_length,(ulong)local_20->str)
    ;
  }
  spvTextDestroy(local_20);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Disassemble(const uint32_t* binary, const size_t binary_size,
                             std::string* text, uint32_t options) const {
  spv_text spvtext = nullptr;
  spv_result_t status = spvBinaryToText(impl_->context, binary, binary_size,
                                        options, &spvtext, nullptr);
  if (status == SPV_SUCCESS &&
      (options & SPV_BINARY_TO_TEXT_OPTION_PRINT) == 0) {
    assert(spvtext);
    text->assign(spvtext->str, spvtext->str + spvtext->length);
  }
  spvTextDestroy(spvtext);
  return status == SPV_SUCCESS;
}